

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

bool __thiscall QFSFileEnginePrivate::openFh(QFSFileEnginePrivate *this,OpenMode openMode,FILE *fh)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  QFSFileEngine *pQVar4;
  int *piVar5;
  FILE *in_RDX;
  QFSFileEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  int ret;
  QFSFileEngine *q;
  OpenModeFlag in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  FileError error;
  uint in_stack_ffffffffffffffa4;
  bool local_2d;
  Int local_2c;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = q_func(in_RDI);
  error = (FileError)((ulong)pQVar4 >> 0x20);
  in_RDI->fh = (FILE *)in_RDX;
  in_RDI->fd = -1;
  local_10.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
       (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
       QFlags<QIODeviceBase::OpenModeFlag>::operator&
                 ((QFlags<QIODeviceBase::OpenModeFlag> *)
                  CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                  in_stack_ffffffffffffff8c);
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_10);
  if (bVar1) {
    do {
      iVar2 = fseeko64(in_RDX,0,2);
      in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 & 0xffffff;
      if (iVar2 != 0) {
        piVar5 = __errno_location();
        in_stack_ffffffffffffffa4 = CONCAT13(*piVar5 == 4,(int3)in_stack_ffffffffffffffa4);
      }
    } while ((char)(in_stack_ffffffffffffffa4 >> 0x18) != '\0');
    if (iVar2 != 0) {
      piVar5 = __errno_location();
      uVar3 = 5;
      if (*piVar5 == 0x18) {
        uVar3 = 4;
      }
      __errno_location();
      QSystemError::stdString(error);
      QAbstractFileEngine::setError
                ((QAbstractFileEngine *)CONCAT44(in_stack_ffffffffffffffa4,uVar3),error,
                 (QString *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      QString::~QString((QString *)0x19d379);
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                ((QFlags<QIODeviceBase::OpenModeFlag> *)
                 CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
      (in_RDI->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
      super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = local_2c;
      in_RDI->fh = (FILE *)0x0;
      local_2d = false;
      goto LAB_0019d3aa;
    }
  }
  local_2d = true;
LAB_0019d3aa:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_2d;
}

Assistant:

bool QFSFileEnginePrivate::openFh(QIODevice::OpenMode openMode, FILE *fh)
{
    Q_ASSERT_X(openMode & QIODevice::Unbuffered, "QFSFileEngine::open",
               "QFSFileEngine no longer supports buffered mode; upper layer must buffer");

    Q_Q(QFSFileEngine);
    this->fh = fh;
    fd = -1;

    // Seek to the end when in Append mode.
    if (openMode & QIODevice::Append) {
        int ret;
        do {
            ret = QT_FSEEK(fh, 0, SEEK_END);
        } while (ret != 0 && errno == EINTR);

        if (ret != 0) {
            q->setError(errno == EMFILE ? QFile::ResourceError : QFile::OpenError,
                        QSystemError::stdString(errno));

            this->openMode = QIODevice::NotOpen;
            this->fh = nullptr;

            return false;
        }
    }

    return true;
}